

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

size_t mbedtls_clz(mbedtls_mpi_uint x)

{
  ulong local_20;
  mbedtls_mpi_uint mask;
  size_t j;
  mbedtls_mpi_uint x_local;
  
  mask = 0;
  for (local_20 = 0x8000000000000000; (mask < 0x40 && ((x & local_20) == 0));
      local_20 = local_20 >> 1) {
    mask = mask + 1;
  }
  return mask;
}

Assistant:

static size_t mbedtls_clz( const mbedtls_mpi_uint x )
{
    size_t j;
    mbedtls_mpi_uint mask = (mbedtls_mpi_uint) 1 << (biL - 1);

    for( j = 0; j < biL; j++ )
    {
        if( x & mask ) break;

        mask >>= 1;
    }

    return j;
}